

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool search_file_recursive(char *path,char *wildcard,char *result,uint *pc,uint max)

{
  ulong uVar1;
  DIR *pDVar2;
  uint max_00;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  dirent *pdVar6;
  long lVar7;
  uint *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  uint in_R8D;
  _Bool found;
  dirent *entry;
  char temp [260];
  char opendirpath [260];
  DIR *dir;
  char *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  char local_258 [548];
  undefined4 in_stack_ffffffffffffffd0;
  _Bool local_1;
  
  sVar5 = strlen(in_RDI);
  if (sVar5 + 1 < 0x105) {
    clear_path_string(in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    register0x00000000 = opendir(in_RDI);
    if (register0x00000000 == (DIR *)0x0) {
      local_1 = false;
    }
    else {
      local_1 = false;
      do {
        while( true ) {
          do {
            do {
              pdVar6 = readdir(stack0xffffffffffffffc8);
              if (pdVar6 == (dirent *)0x0) goto LAB_00194dae;
              iVar4 = strcmp(pdVar6->d_name,".");
            } while ((iVar4 == 0) || (iVar4 = strcmp(pdVar6->d_name,".."), iVar4 == 0));
            sVar5 = strlen(in_RDI);
            lVar7 = sVar5 + 1;
            sVar5 = strlen(pdVar6->d_name);
          } while (0x104 < lVar7 + sVar5 + 2);
          strcpy(local_258,in_RDI);
          strcat(local_258,G_SLASH_CHAR);
          strcat(local_258,pdVar6->d_name);
          _Var3 = exists_dir((char *)temp._24_8_);
          pDVar2 = stack0xffffffffffffffc8;
          if (_Var3) break;
          *in_RCX = *in_RCX + 1;
          if (in_R8D < *in_RCX) goto LAB_00194dae;
          _Var3 = wildcard_match(in_stack_fffffffffffffd88,(char *)0x194d87);
          if (_Var3) {
            strcpy(in_RDX,local_258);
            local_1 = true;
            goto LAB_00194dae;
          }
        }
        uVar1 = (ulong)stack0xffffffffffffffc8 >> 0x20;
        max_00 = (uint)uVar1;
        unique0x1000024e = pDVar2;
        _Var3 = search_file_recursive
                          (in_RSI,in_RDX,(char *)in_RCX,
                           (uint *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),max_00);
        if (_Var3) {
          local_1 = true;
          break;
        }
      } while (*in_RCX <= in_R8D);
LAB_00194dae:
      closedir(stack0xffffffffffffffc8);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool search_file_recursive(const char *path, const char *wildcard, char *result, unsigned int *pc, const unsigned int max)
{
	if (strlen(path) + 1 > MAX_PATH)
	{
		return false;
	}
	DIR *dir;
	char opendirpath[MAX_PATH];
	clear_path_string(opendirpath, MAX_PATH);
#if defined(_WIN32)
	char *res = u8tosjis_path(path, opendirpath);
	if (res == NULL)
	{
		return false;
	}
	if ((dir = opendir(opendirpath)) == NULL)
#else
	if ((dir = opendir(path)) == NULL)
#endif
	{
		return false;
	}
	char temp[MAX_PATH];
	struct dirent *entry;
	bool found = false;
	while ((entry = readdir(dir)) != NULL)
	{
		if (strcmp(entry->d_name, ".") == 0 || strcmp(entry->d_name, "..") == 0)
		{
			continue;
		}
		if (strlen(path) + 1 + strlen(entry->d_name) + 2 > MAX_PATH)
		{
			continue;
		}
		strcpy(temp, path);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, entry->d_name);
		if (exists_dir(temp))
		{
			if (search_file_recursive(temp, wildcard, result, pc, max))
			{
				found = true;
				break;
			}
			if (*pc > max)
			{
				break;
			}
		}
		else
		{
			*pc += 1;
			if (*pc > max)
			{
				break;
			}

			if (!wildcard_match(wildcard, entry->d_name))
			{
				continue;
			}
			strcpy(result, temp);
			found = true;
			break;
		}
	}
	closedir(dir);
	return found;
}